

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_f1a3f9::TargetPrecompileHeadersImpl::HandleMissingTarget
          (TargetPrecompileHeadersImpl *this,string *name)

{
  cmMakefile *this_00;
  string local_30;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  cmStrCat<char_const(&)[47],std::__cxx11::string_const&,char_const(&)[38]>
            (&local_30,(char (*) [47])"Cannot specify precompile headers for target \"",name,
             (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify precompile headers for target \"", name,
               "\" which is not built by this project."));
  }